

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstree.cpp
# Opt level: O0

BSTNode * __thiscall search::BSTNode::successor(BSTNode *this)

{
  code *pcVar1;
  BSTNode *pBVar2;
  bool bVar3;
  BSTNode *local_20;
  BSTNode *p;
  BSTNode *node;
  BSTNode *this_local;
  
  if (this->right_ != (BSTNode *)0x0) {
    pBVar2 = min(this->right_);
    return pBVar2;
  }
  local_20 = this->parent_;
  p = this;
  while( true ) {
    bVar3 = false;
    if (local_20 != (BSTNode *)0x0) {
      bVar3 = local_20->right_ == p;
    }
    if (!bVar3) break;
    p = local_20;
    local_20 = local_20->parent_;
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

BSTNode* BSTNode::successor()
    {
        if (right_)
            return right_->min();
        else
        {
            BSTNode* node = this;
            BSTNode* p = parent_;
            while (p && p->right_ == node)
            {
                node = p;
                p = node->parent_;
            }
        }
    }